

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O0

void solver_debug_check_trail(solver_t *s)

{
  vec_char_t *p;
  FILE *pFVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  vec_uint_t *dest;
  uint *puVar6;
  vec_uint_t *trail_dup;
  uint *array;
  uint i;
  solver_t *s_local;
  
  dest = vec_uint_alloc(0);
  pFVar1 = _stdout;
  uVar4 = vec_uint_size(s->trail);
  fprintf(pFVar1,"[Satoko] Checking for trail(%u) inconsistencies...\n",(ulong)uVar4);
  vec_uint_duplicate(dest,s->trail);
  vec_uint_sort(dest,1);
  puVar6 = vec_uint_data(dest);
  array._4_4_ = 1;
  while( true ) {
    uVar4 = vec_uint_size(dest);
    if (uVar4 <= array._4_4_) {
      array._4_4_ = 0;
      while( true ) {
        uVar4 = vec_uint_size(dest);
        if (uVar4 <= array._4_4_) {
          fprintf(_stdout,"[Satoko] Trail OK.\n");
          vec_uint_print(dest);
          vec_uint_free(dest);
          return;
        }
        uVar4 = lit2var(puVar6[array._4_4_]);
        cVar2 = var_value(s,uVar4);
        cVar3 = lit_polarity(puVar6[array._4_4_]);
        pFVar1 = _stdout;
        if (cVar2 != cVar3) break;
        array._4_4_ = array._4_4_ + 1;
      }
      p = s->assigns;
      uVar4 = lit2var(puVar6[array._4_4_]);
      cVar2 = vec_char_at(p,uVar4);
      fprintf(pFVar1,"[Satoko] Inconsistent trail assignment: %u, %u\n",(ulong)(uint)(int)cVar2,
              (ulong)puVar6[array._4_4_]);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver.c"
                    ,0x2cb,"void solver_debug_check_trail(solver_t *)");
    }
    uVar4 = puVar6[array._4_4_ - 1];
    uVar5 = lit_compl(puVar6[array._4_4_]);
    if (uVar4 == uVar5) break;
    array._4_4_ = array._4_4_ + 1;
  }
  fprintf(_stdout,"[Satoko] Inconsistent trail: %u %u\n",(ulong)puVar6[array._4_4_ - 1],
          (ulong)puVar6[array._4_4_]);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver.c"
                ,0x2c4,"void solver_debug_check_trail(solver_t *)");
}

Assistant:

void solver_debug_check_trail(solver_t *s)
{
    unsigned i;
    unsigned *array;
    vec_uint_t *trail_dup = vec_uint_alloc(0);
    fprintf(stdout, "[Satoko] Checking for trail(%u) inconsistencies...\n", vec_uint_size(s->trail));
    vec_uint_duplicate(trail_dup, s->trail);
    vec_uint_sort(trail_dup, 1);
    array = vec_uint_data(trail_dup);
    for (i = 1; i < vec_uint_size(trail_dup); i++) {
        if (array[i - 1] == lit_compl(array[i])) {
            fprintf(stdout, "[Satoko] Inconsistent trail: %u %u\n", array[i - 1], array[i]);
            assert(0);
            return;
        }
    }
    for (i = 0; i < vec_uint_size(trail_dup); i++) {
        if (var_value(s, lit2var(array[i])) != lit_polarity(array[i])) {
            fprintf(stdout, "[Satoko] Inconsistent trail assignment: %u, %u\n", vec_char_at(s->assigns, lit2var(array[i])), array[i]);
            assert(0);
            return;
        }
    }
    fprintf(stdout, "[Satoko] Trail OK.\n");
    vec_uint_print(trail_dup);
    vec_uint_free(trail_dup);

}